

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  undefined1 n_00 [16];
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int *in_RCX;
  buffer<char> *in_RDX;
  int in_ESI;
  uint in_EDI;
  bool bVar6;
  byte in_stack_00000008;
  int in_stack_00000018;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_3;
  int i;
  char digit_2;
  int result_1;
  bool high;
  bool low;
  int digit_1;
  char *data;
  bool shortest;
  int even;
  int shift;
  bool is_predecessor_closer;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  bigint *in_stack_fffffffffffffc00;
  size_t in_stack_fffffffffffffc08;
  bigint *in_stack_fffffffffffffc10;
  bigint *in_stack_fffffffffffffc18;
  bigint *in_stack_fffffffffffffc20;
  bigint *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  bigint *in_stack_fffffffffffffc38;
  int local_364;
  int local_358;
  char local_354;
  int local_350;
  undefined1 *local_2f0;
  undefined1 local_2e8 [176];
  undefined1 local_238 [544];
  int *local_18;
  buffer<char> *local_10;
  int local_8;
  uint local_4;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  bigint::bigint(in_stack_fffffffffffffc20);
  bigint::bigint(in_stack_fffffffffffffc20);
  bigint::bigint(in_stack_fffffffffffffc20);
  bigint::bigint(in_stack_fffffffffffffc20);
  local_2f0 = (undefined1 *)0x0;
  bVar6 = (local_4 & 1) != 0;
  if (in_stack_00000018 < 0) {
    if (*local_18 < 0) {
      bigint::assign_pow10(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      bigint::assign(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if (bVar6) {
        bigint::assign(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        bigint::operator<<=(in_stack_fffffffffffffc28,
                            (int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
        local_2f0 = local_2e8;
      }
      iVar2 = (int)((ulong)in_stack_fffffffffffffc20 >> 0x20);
      value_00._8_8_ = in_stack_fffffffffffffc18;
      value_00._0_8_ = in_stack_fffffffffffffc10;
      bigint::operator*=(in_stack_fffffffffffffc28,(unsigned___int128)value_00);
      bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
      bigint::operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
    }
    else {
      n_00._8_8_ = in_stack_fffffffffffffc18;
      n_00._0_8_ = in_stack_fffffffffffffc10;
      bigint::operator=(in_stack_fffffffffffffc28,(unsigned___int128)n_00);
      iVar2 = (int)((ulong)in_stack_fffffffffffffc20 >> 0x20);
      bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
      bigint::assign_pow10(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
      bigint::operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      if (bVar6) {
        bigint::operator=(in_stack_fffffffffffffc00,
                          CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        local_2f0 = local_2e8;
      }
    }
  }
  else {
    n._8_8_ = in_stack_fffffffffffffc18;
    n._0_8_ = in_stack_fffffffffffffc10;
    bigint::operator=(in_stack_fffffffffffffc28,(unsigned___int128)n);
    iVar2 = (int)((ulong)in_stack_fffffffffffffc20 >> 0x20);
    bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
    bigint::operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
    bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
    if (bVar6) {
      bigint::operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
      local_2f0 = local_2e8;
    }
    bigint::assign_pow10(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
    bigint::operator<<=(in_stack_fffffffffffffc28,iVar2);
  }
  uVar1 = (uint)((in_stack_00000008 & 1) == 0);
  if (local_2f0 == (undefined1 *)0x0) {
    local_2f0 = local_238;
  }
  bVar6 = local_8 < 0;
  if ((local_4 & 2) != 0) {
    iVar2 = add_compare(in_stack_fffffffffffffc38,
                        (bigint *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                        in_stack_fffffffffffffc28);
    if ((int)(iVar2 + uVar1) < 1) {
      *local_18 = *local_18 + -1;
      bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      if ((local_8 < 0) &&
         (bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc),
         local_2f0 != local_238)) {
        bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      }
    }
    if ((local_4 & 4) != 0) {
      adjust_precision((int *)in_stack_fffffffffffffc10,(int)(in_stack_fffffffffffffc08 >> 0x20));
    }
  }
  if (bVar6) {
    local_8 = 0;
    pcVar5 = buffer<char>::data(local_10);
    while( true ) {
      iVar2 = bigint::divmod_assign(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      iVar3 = compare(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      iVar4 = add_compare(in_stack_fffffffffffffc38,
                          (bigint *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                          in_stack_fffffffffffffc28);
      bVar6 = 0 < (int)(iVar4 + uVar1);
      iVar4 = local_8 + 1;
      pcVar5[local_8] = (char)iVar2 + '0';
      if (((int)(iVar3 - uVar1) < 0) || (bVar6)) break;
      local_8 = iVar4;
      bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      if (local_2f0 != local_238) {
        bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      }
    }
    if ((int)(iVar3 - uVar1) < 0) {
      local_8 = iVar4;
      if ((bVar6) &&
         ((iVar3 = add_compare(in_stack_fffffffffffffc38,
                               (bigint *)
                               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                               in_stack_fffffffffffffc28), 0 < iVar3 ||
          ((iVar3 == 0 && (iVar2 % 2 != 0)))))) {
        pcVar5[local_8 + -1] = pcVar5[local_8 + -1] + '\x01';
      }
    }
    else {
      pcVar5[local_8] = pcVar5[local_8] + '\x01';
      local_8 = iVar4;
    }
    to_unsigned<int>(0);
    buffer<char>::try_resize((buffer<char> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    *local_18 = *local_18 - (local_8 + -1);
  }
  else {
    *local_18 = *local_18 - (local_8 + -1);
    if (local_8 < 1) {
      bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      add_compare(in_stack_fffffffffffffc38,
                  (bigint *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                  in_stack_fffffffffffffc28);
      buffer<char>::push_back
                ((buffer<char> *)in_stack_fffffffffffffc00,
                 (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    }
    else {
      to_unsigned<int>(0);
      buffer<char>::try_resize((buffer<char> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      for (local_350 = 0; local_350 < local_8 + -1; local_350 = local_350 + 1) {
        iVar2 = bigint::divmod_assign(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
        local_354 = (char)iVar2;
        pcVar5 = buffer<char>::operator[]<int>(local_10,local_350);
        *pcVar5 = local_354 + '0';
        bigint::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      }
      local_358 = bigint::divmod_assign(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      iVar2 = add_compare(in_stack_fffffffffffffc38,
                          (bigint *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                          in_stack_fffffffffffffc28);
      if ((0 < iVar2) || ((iVar2 == 0 && (local_358 % 2 != 0)))) {
        if (local_358 == 9) {
          pcVar5 = buffer<char>::operator[]<int>(local_10,local_8 + -1);
          *pcVar5 = ':';
          iVar2 = local_8;
          while( true ) {
            local_364 = iVar2 + -1;
            bVar6 = false;
            if (0 < local_364) {
              pcVar5 = buffer<char>::operator[]<int>(local_10,local_364);
              bVar6 = *pcVar5 == ':';
            }
            if (!bVar6) break;
            pcVar5 = buffer<char>::operator[]<int>(local_10,local_364);
            *pcVar5 = '0';
            pcVar5 = buffer<char>::operator[]<int>(local_10,iVar2 + -2);
            *pcVar5 = *pcVar5 + '\x01';
            iVar2 = local_364;
          }
          pcVar5 = buffer<char>::operator[]<int>(local_10,0);
          if (*pcVar5 == ':') {
            pcVar5 = buffer<char>::operator[]<int>(local_10,0);
            *pcVar5 = '1';
            if ((local_4 & 4) == 0) {
              *local_18 = *local_18 + 1;
            }
            else {
              buffer<char>::push_back
                        ((buffer<char> *)in_stack_fffffffffffffc00,
                         (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            }
          }
          goto LAB_00371e7f;
        }
        local_358 = local_358 + 1;
      }
      local_358._0_1_ = (char)local_358 + '0';
      pcVar5 = buffer<char>::operator[]<int>(local_10,local_8 + -1);
      *pcVar5 = (char)local_358;
    }
  }
LAB_00371e7f:
  bigint::~bigint((bigint *)0x371e8c);
  bigint::~bigint((bigint *)0x371e99);
  bigint::~bigint((bigint *)0x371ea6);
  bigint::~bigint((bigint *)0x371eb3);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  bool shortest = num_digits < 0;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (shortest) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits <= 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        if ((flags & dragon::fixed) != 0)
          buf.push_back('0');
        else
          ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}